

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTensors.h
# Opt level: O1

double __thiscall chrono::ChVoightTensor<double>::GetInvariant_J2(ChVoightTensor<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  dVar1 = (this->super_ChVectorN<double,_6>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar1;
  dVar2 = (this->super_ChVectorN<double,_6>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar2;
  dVar3 = (this->super_ChVectorN<double,_6>).
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar3;
  dVar1 = dVar1 + dVar2 + dVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar3 * dVar2;
  auVar8 = vfmadd231sd_fma(auVar11,auVar4,auVar8);
  auVar8 = vfmadd231sd_fma(auVar8,auVar4,auVar10);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->super_ChVectorN<double,_6>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [3];
  auVar8 = vfnmadd213sd_fma(auVar5,auVar5,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (this->super_ChVectorN<double,_6>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [5];
  auVar8 = vfnmadd213sd_fma(auVar9,auVar9,auVar8);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (this->super_ChVectorN<double,_6>).
                 super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array
                 [4];
  auVar8 = vfnmadd213sd_fma(auVar6,auVar6,auVar8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (dVar1 * dVar1) / 3.0 - auVar8._0_8_;
  auVar8 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar7);
  return auVar8._0_8_;
}

Assistant:

Real GetInvariant_I2() const {
        return XX() * YY() + YY() * ZZ() + XX() * ZZ() - XY() * XY() - YZ() * YZ() - XZ() * XZ();
    }